

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool processSources(cmGeneratorTarget *tgt,
                   vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                   *entries,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *srcs,
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *uniqueSrcs,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
                   bool debugSources)

{
  TargetPropertyEntry *pTVar1;
  pointer pcVar2;
  cmLocalGenerator *this;
  byte bVar3;
  pointer pbVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  cmSourceFile *this_00;
  string *psVar7;
  ostream *poVar8;
  long *plVar9;
  cmake *pcVar10;
  string *psVar11;
  size_type *psVar12;
  long lVar13;
  char *pcVar14;
  pointer __args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  __hashtable *__h;
  bool bVar16;
  bool bVar17;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar18;
  byte local_2a9;
  string e;
  string fullPath;
  string local_258;
  string *local_238;
  TargetPropertyEntry *local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entrySources;
  long *local_210 [2];
  long local_200 [2];
  pointer local_1f0;
  cmGeneratorExpressionDAGChecker *local_1e8;
  string *local_1e0;
  pointer local_1d8;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_1d0;
  cmMakefile *local_1c8;
  string *local_1c0;
  cmListFileBacktrace local_1b8;
  string usedSources;
  ios_base local_138 [264];
  
  local_1e8 = dagChecker;
  local_1e0 = config;
  local_1d0 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)srcs;
  local_1c8 = cmTarget::GetMakefile(tgt->Target);
  local_1d8 = (entries->
              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_1f0 = (entries->
              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  bVar16 = local_1d8 == local_1f0;
  if (bVar16) {
    bVar3 = 0;
  }
  else {
    bVar3 = 0;
    do {
      pTVar1 = *local_1d8;
      local_238 = cmLinkItem::AsStr_abi_cxx11_(&pTVar1->LinkImplItem->super_cmLinkItem);
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
      usedSources._M_string_length = 0;
      usedSources.field_2._M_local_buf[0] = '\0';
      local_230 = pTVar1;
      iVar6 = (*pTVar1->_vptr_TargetPropertyEntry[2])
                        (pTVar1,tgt->LocalGenerator,local_1e0,0,tgt,tgt,local_1e8,
                         (cmGeneratorTarget *)&usedSources);
      cmSystemTools::ExpandListArgument((string *)CONCAT44(extraout_var,iVar6),&entrySources,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)usedSources._M_dataplus._M_p != &usedSources.field_2) {
        operator_delete(usedSources._M_dataplus._M_p,
                        CONCAT71(usedSources.field_2._M_allocated_capacity._1_7_,
                                 usedSources.field_2._M_local_buf[0]) + 1);
      }
      iVar6 = (*local_230->_vptr_TargetPropertyEntry[6])();
      if ((char)iVar6 != '\0') {
        bVar3 = 1;
      }
      bVar17 = entrySources.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               entrySources.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_1c0 = entrySources.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      psVar11 = entrySources.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      while (!bVar17) {
        this_00 = cmMakefile::GetOrCreateSource(local_1c8,psVar11,false,Ambiguous);
        e._M_dataplus._M_p = (pointer)&e.field_2;
        e._M_string_length = 0;
        e.field_2._M_allocated_capacity = e.field_2._M_allocated_capacity & 0xffffffffffffff00;
        psVar7 = cmSourceFile::GetFullPath(this_00,&e);
        pcVar2 = (psVar7->_M_dataplus)._M_p;
        fullPath._M_dataplus._M_p = (pointer)&fullPath.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&fullPath,pcVar2,pcVar2 + psVar7->_M_string_length);
        if (fullPath._M_string_length == 0) {
          if (e._M_string_length != 0) {
            pcVar10 = cmLocalGenerator::GetCMakeInstance(tgt->LocalGenerator);
            cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&usedSources);
            cmake::IssueMessage(pcVar10,FATAL_ERROR,&e,(cmListFileBacktrace *)&usedSources);
            if (usedSources._M_string_length != 0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         usedSources._M_string_length);
            }
          }
LAB_002ee683:
          bVar5 = false;
          local_2a9 = bVar3;
        }
        else {
          if ((local_238->_M_string_length != 0) &&
             (bVar5 = cmsys::SystemTools::FileIsFullPath(psVar11), !bVar5)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&usedSources);
            if (local_238->_M_string_length == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&usedSources,
                         "Found relative path while evaluating sources of \"",0x31);
              psVar7 = cmTarget::GetName_abi_cxx11_(tgt->Target);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&usedSources,(psVar7->_M_dataplus)._M_p,
                                  psVar7->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\":\n  \"",6);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
              lVar13 = 2;
              pcVar14 = "\"\n";
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&usedSources,"Target \"",8);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&usedSources,(local_238->_M_dataplus)._M_p,
                                  local_238->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,"\" contains relative path in its INTERFACE_SOURCES:\n  \"",0x36);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
              lVar13 = 1;
              pcVar14 = "\"";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar14,lVar13);
            this = tgt->LocalGenerator;
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(this,FATAL_ERROR,&local_258);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&usedSources);
            std::ios_base::~ios_base(local_138);
            goto LAB_002ee683;
          }
          bVar5 = true;
          std::__cxx11::string::_M_assign((string *)psVar11);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fullPath._M_dataplus._M_p != &fullPath.field_2) {
          operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)e._M_dataplus._M_p != &e.field_2) {
          operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
        }
        if (!bVar5) break;
        psVar11 = psVar11 + 1;
        bVar17 = psVar11 == local_1c0;
      }
      pbVar4 = entrySources.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      paVar15 = &fullPath.field_2;
      if (!bVar17) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&entrySources);
        break;
      }
      usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
      usedSources._M_string_length = 0;
      usedSources.field_2._M_local_buf[0] = '\0';
      for (__args = entrySources.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args != pbVar4; __args = __args + 1
          ) {
        e._M_dataplus._M_p = (pointer)uniqueSrcs;
        pVar18 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::
                 _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)uniqueSrcs,__args,&e);
        if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          (*local_230->_vptr_TargetPropertyEntry[4])(&e);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string_const&,cmListFileBacktrace>
                    (local_1d0,__args,(cmListFileBacktrace *)&e);
          if (e._M_string_length != 0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)e._M_string_length);
          }
          if (debugSources) {
            std::operator+(&fullPath," * ",__args);
            plVar9 = (long *)std::__cxx11::string::append((char *)&fullPath);
            e._M_dataplus._M_p = (pointer)&e.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((size_type *)*plVar9 == psVar12) {
              e.field_2._M_allocated_capacity = *psVar12;
              e.field_2._8_8_ = plVar9[3];
            }
            else {
              e.field_2._M_allocated_capacity = *psVar12;
              e._M_dataplus._M_p = (pointer)*plVar9;
            }
            e._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&usedSources,(ulong)e._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)e._M_dataplus._M_p != &e.field_2) {
              operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fullPath._M_dataplus._M_p != paVar15) {
              operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      if (usedSources._M_string_length != 0) {
        pcVar10 = cmLocalGenerator::GetCMakeInstance(tgt->LocalGenerator);
        local_210[0] = local_200;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_210,"Used sources for target ","");
        psVar11 = cmTarget::GetName_abi_cxx11_(tgt->Target);
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_210,(ulong)(psVar11->_M_dataplus)._M_p);
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_258.field_2._M_allocated_capacity = *psVar12;
          local_258.field_2._8_8_ = plVar9[3];
        }
        else {
          local_258.field_2._M_allocated_capacity = *psVar12;
          local_258._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_258._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_258);
        psVar12 = (size_type *)(plVar9 + 2);
        if ((size_type *)*plVar9 == psVar12) {
          fullPath.field_2._M_allocated_capacity = *psVar12;
          fullPath.field_2._8_8_ = plVar9[3];
          fullPath._M_dataplus._M_p = (pointer)paVar15;
        }
        else {
          fullPath.field_2._M_allocated_capacity = *psVar12;
          fullPath._M_dataplus._M_p = (pointer)*plVar9;
        }
        fullPath._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&fullPath,(ulong)usedSources._M_dataplus._M_p);
        e._M_dataplus._M_p = (pointer)&e.field_2;
        psVar12 = (size_type *)(plVar9 + 2);
        if ((size_type *)*plVar9 == psVar12) {
          e.field_2._M_allocated_capacity = *psVar12;
          e.field_2._8_8_ = plVar9[3];
        }
        else {
          e.field_2._M_allocated_capacity = *psVar12;
          e._M_dataplus._M_p = (pointer)*plVar9;
        }
        e._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        (*local_230->_vptr_TargetPropertyEntry[4])(&local_1b8);
        cmake::IssueMessage(pcVar10,LOG,&e,&local_1b8);
        if (local_1b8.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1b8.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)e._M_dataplus._M_p != &e.field_2) {
          operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fullPath._M_dataplus._M_p != paVar15) {
          operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if (local_210[0] != local_200) {
          operator_delete(local_210[0],local_200[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)usedSources._M_dataplus._M_p != &usedSources.field_2) {
        operator_delete(usedSources._M_dataplus._M_p,
                        CONCAT71(usedSources.field_2._M_allocated_capacity._1_7_,
                                 usedSources.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&entrySources);
      local_1d8 = local_1d8 + 1;
      bVar16 = local_1d8 == local_1f0;
    } while (!bVar16);
  }
  if (bVar16) {
    local_2a9 = bVar3;
  }
  return (bool)(local_2a9 & 1);
}

Assistant:

static bool processSources(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<BT<std::string>>& srcs,
  std::unordered_set<std::string>& uniqueSrcs,
  cmGeneratorExpressionDAGChecker* dagChecker, std::string const& config,
  bool debugSources)
{
  cmMakefile* mf = tgt->Target->GetMakefile();

  bool contextDependent = false;

  for (cmGeneratorTarget::TargetPropertyEntry* entry : entries) {
    cmLinkImplItem const& item = entry->LinkImplItem;
    std::string const& targetName = item.AsStr();
    std::vector<std::string> entrySources;
    cmSystemTools::ExpandListArgument(entry->Evaluate(tgt->GetLocalGenerator(),
                                                      config, false, tgt, tgt,
                                                      dagChecker),
                                      entrySources);

    if (entry->GetHadContextSensitiveCondition()) {
      contextDependent = true;
    }

    for (std::string& src : entrySources) {
      cmSourceFile* sf = mf->GetOrCreateSource(src);
      std::string e;
      std::string fullPath = sf->GetFullPath(&e);
      if (fullPath.empty()) {
        if (!e.empty()) {
          cmake* cm = tgt->GetLocalGenerator()->GetCMakeInstance();
          cm->IssueMessage(MessageType::FATAL_ERROR, e, tgt->GetBacktrace());
        }
        return contextDependent;
      }

      if (!targetName.empty() && !cmSystemTools::FileIsFullPath(src)) {
        std::ostringstream err;
        if (!targetName.empty()) {
          err << "Target \"" << targetName
              << "\" contains relative path in its INTERFACE_SOURCES:\n  \""
              << src << "\"";
        } else {
          err << "Found relative path while evaluating sources of \""
              << tgt->GetName() << "\":\n  \"" << src << "\"\n";
        }
        tgt->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                               err.str());
        return contextDependent;
      }
      src = fullPath;
    }
    std::string usedSources;
    for (std::string const& src : entrySources) {
      if (uniqueSrcs.insert(src).second) {
        srcs.emplace_back(src, entry->GetBacktrace());
        if (debugSources) {
          usedSources += " * " + src + "\n";
        }
      }
    }
    if (!usedSources.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used sources for target ") + tgt->GetName() + ":\n" +
          usedSources,
        entry->GetBacktrace());
    }
  }
  return contextDependent;
}